

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_pole_digital_filter.cc
# Opt level: O1

bool __thiscall
sptk::AllPoleDigitalFilter::Run
          (AllPoleDigitalFilter *this,vector<double,_std::allocator<double>_> *filter_coefficients,
          double filter_input,double *filter_output,Buffer *buffer)

{
  uint uVar1;
  pointer __s;
  pointer pdVar2;
  double *pdVar3;
  double *pdVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  size_type __new_size;
  ulong uVar8;
  double dVar9;
  
  if (this->is_valid_ == true) {
    bVar5 = false;
    if (((buffer != (Buffer *)0x0) && (bVar5 = false, filter_output != (double *)0x0)) &&
       (__new_size = (size_type)this->num_filter_order_, bVar5 = false,
       (long)(filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3 == __new_size + 1)) {
      if ((long)(buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(&buffer->d_,__new_size);
        __s = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
        pdVar2 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (__s != pdVar2) {
          memset(__s,0,((long)pdVar2 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
        }
      }
      pdVar3 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dVar9 = filter_input * *pdVar3;
      uVar1 = this->num_filter_order_;
      uVar6 = (ulong)uVar1;
      if (uVar6 != 0) {
        pdVar4 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (this->transposition_ == false) {
          if (1 < (int)uVar1) {
            lVar7 = uVar6 + 1;
            do {
              dVar9 = dVar9 - pdVar3[lVar7 + -1] * pdVar4[lVar7 + -2];
              pdVar4[lVar7 + -2] = pdVar4[lVar7 + -3];
              lVar7 = lVar7 + -1;
            } while (2 < lVar7);
          }
          dVar9 = dVar9 - pdVar3[1] * *pdVar4;
          *pdVar4 = dVar9;
        }
        else {
          dVar9 = dVar9 - *pdVar4;
          if (1 < (int)uVar1) {
            uVar8 = 1;
            do {
              pdVar4[uVar8 - 1] = pdVar3[uVar8] * dVar9 + pdVar4[uVar8];
              uVar8 = uVar8 + 1;
            } while (uVar6 != uVar8);
          }
          pdVar4[(long)(int)uVar1 + -1] = pdVar3[(int)uVar1] * dVar9;
        }
      }
      *filter_output = dVar9;
      bVar5 = true;
    }
    return bVar5;
  }
  return false;
}

Assistant:

bool AllPoleDigitalFilter::Run(const std::vector<double>& filter_coefficients,
                               double filter_input, double* filter_output,
                               AllPoleDigitalFilter::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ ||
      filter_coefficients.size() !=
          static_cast<std::size_t>(num_filter_order_ + 1) ||
      NULL == filter_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->d_.size() != static_cast<std::size_t>(num_filter_order_)) {
    buffer->d_.resize(num_filter_order_);
    std::fill(buffer->d_.begin(), buffer->d_.end(), 0.0);
  }

  const double gained_input(filter_input * filter_coefficients[0]);
  if (0 == num_filter_order_) {
    *filter_output = gained_input;
    return true;
  }

  const double* a(&(filter_coefficients[1]));
  double* d(&buffer->d_[0]);
  double sum(gained_input);

  // Apply all-pole filter.
  if (transposition_) {
    sum -= d[0];
    for (int m(1); m < num_filter_order_; ++m) {
      d[m - 1] = d[m] + a[m - 1] * sum;
    }
    d[num_filter_order_ - 1] = a[num_filter_order_ - 1] * sum;
  } else {
    for (int m(num_filter_order_ - 1); 0 < m; --m) {
      sum -= a[m] * d[m];
      d[m] = d[m - 1];
    }
    sum -= a[0] * d[0];
    d[0] = sum;
  }

  // Save result.
  *filter_output = sum;

  return true;
}